

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_radio_interface.c
# Opt level: O3

dlep_radio_if * dlep_radio_add_interface(char *ifname)

{
  int iVar1;
  avl_tree *tree;
  avl_node *paVar2;
  dlep_radio_if *pdVar3;
  
  tree = dlep_if_get_tree(true);
  paVar2 = avl_find(tree,ifname);
  if (paVar2 == (avl_node *)0x0) {
    pdVar3 = (dlep_radio_if *)oonf_class_malloc(&_interface_class);
    if (pdVar3 != (dlep_radio_if *)0x0) {
      iVar1 = dlep_if_add((dlep_if *)pdVar3,ifname,&_l2_origin,&_l2_default_origin,
                          (_func_int_os_interface_listener_ptr *)0x0,LOG_DLEP_RADIO,true);
      if (iVar1 == 0) {
        (pdVar3->tcp).config.session_timeout = 120000;
        (pdVar3->tcp).config.maximum_input_buffer = 0x1000;
        (pdVar3->tcp).config.allowed_sessions = 3;
        dlep_radio_session_initialize_tcp_callbacks(&(pdVar3->tcp).config);
        oonf_stream_add_managed(&pdVar3->tcp);
        return pdVar3;
      }
      oonf_class_free(&_interface_class,pdVar3);
    }
    pdVar3 = (dlep_radio_if *)0x0;
  }
  else {
    pdVar3 = (dlep_radio_if *)&paVar2[-0x34].parent;
  }
  return pdVar3;
}

Assistant:

struct dlep_radio_if *
dlep_radio_add_interface(const char *ifname) {
  struct dlep_radio_if *interface;

  interface = dlep_radio_get_by_layer2_if(ifname);
  if (interface) {
    return interface;
  }

  interface = oonf_class_malloc(&_interface_class);
  if (!interface) {
    return NULL;
  }

  if (dlep_if_add(&interface->interf, ifname, &_l2_origin, &_l2_default_origin, NULL, LOG_DLEP_RADIO, true)) {
    oonf_class_free(&_interface_class, interface);
    return NULL;
  }

  /* configure TCP server socket */
  interface->tcp.config.session_timeout = 120000; /* 120 seconds */
  interface->tcp.config.maximum_input_buffer = 4096;
  interface->tcp.config.allowed_sessions = 3;
  dlep_radio_session_initialize_tcp_callbacks(&interface->tcp.config);

  oonf_stream_add_managed(&interface->tcp);

  return interface;
}